

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O3

FuncVec * __thiscall
dg::llvmdg::DGCallGraphImpl::callees
          (FuncVec *__return_storage_ptr__,DGCallGraphImpl *this,Function *F)

{
  _Rb_tree_header *p_Var1;
  pointer *pppFVar2;
  long *plVar3;
  iterator __position;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  GenericCallGraph<dg::pta::PSNode_*> *pGVar6;
  GenericCallGraph<dg::pta::PSNode_*> *pGVar7;
  long *plVar8;
  Function *local_28;
  
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var5 = (this->_mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var5 != (_Base_ptr)0x0) {
    p_Var1 = &(this->_mapping)._M_t._M_impl.super__Rb_tree_header;
    p_Var4 = &p_Var1->_M_header;
    do {
      if (*(Function **)(p_Var5 + 1) >= F) {
        p_Var4 = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[*(Function **)(p_Var5 + 1) < F];
    } while (p_Var5 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var4 != p_Var1) && (*(Function **)(p_Var4 + 1) <= F)) {
      pGVar7 = *(GenericCallGraph<dg::pta::PSNode_*> **)(this->_cg + 0x18);
      pGVar6 = this->_cg + 0x10;
      p_Var5 = p_Var4[1]._M_parent;
      do {
        if (*(_Base_ptr *)(pGVar7 + 0x20) >= p_Var5) {
          pGVar6 = pGVar7;
        }
        pGVar7 = *(GenericCallGraph<dg::pta::PSNode_*> **)
                  (pGVar7 + (ulong)(*(_Base_ptr *)(pGVar7 + 0x20) < p_Var5) * 8 + 0x10);
      } while (pGVar7 != (GenericCallGraph<dg::pta::PSNode_*> *)0x0);
      pGVar7 = (GenericCallGraph<dg::pta::PSNode_*> *)0x0;
      if (*(_Base_ptr *)(pGVar6 + 0x20) <= p_Var5) {
        pGVar7 = pGVar6 + 0x28;
      }
      plVar3 = *(long **)(pGVar7 + 0x10);
      for (plVar8 = *(long **)(pGVar7 + 8); plVar8 != plVar3; plVar8 = plVar8 + 1) {
        local_28 = *(Function **)(*(long *)(*plVar8 + 0x38) + 0x18);
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<llvm::Function_const*,std::allocator<llvm::Function_const*>>::
          _M_realloc_insert<llvm::Function_const*>
                    ((vector<llvm::Function_const*,std::allocator<llvm::Function_const*>> *)
                     __return_storage_ptr__,__position,&local_28);
        }
        else {
          *__position._M_current = local_28;
          pppFVar2 = &(__return_storage_ptr__->
                      super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *pppFVar2 = *pppFVar2 + 1;
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

FuncVec callees(const llvm::Function *F) override {
        FuncVec ret;
        auto it = _mapping.find(F);
        if (it == _mapping.end())
            return ret;
        const auto *fnd = _cg.get(it->second);
        for (auto *nd : fnd->getCalls()) {
            ret.push_back(getFunFromNode(nd->getValue()));
        }
        return ret;
    }